

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_update_square_channel(SOUND *snd,UINT32 cycles)

{
  ushort uVar1;
  uint uVar2;
  UINT32 counter;
  UINT16 distance;
  UINT32 cycles_local;
  SOUND *snd_local;
  
  if (((snd->on & 1U) != 0) && (snd->cycles_left = cycles + snd->cycles_left, 0 < snd->cycles_left))
  {
    uVar2 = snd->cycles_left >> 2;
    snd->cycles_left = snd->cycles_left & 3;
    uVar1 = 0x800 - snd->frequency_counter;
    if (uVar2 < uVar1) {
      snd->frequency_counter = snd->frequency_counter + (short)uVar2;
    }
    else {
      uVar2 = uVar2 - uVar1;
      uVar1 = 0x800 - snd->frequency;
      snd->duty_count = snd->duty_count + uVar2 / uVar1 + 1 & 7;
      snd->signal = (INT8)wave_duty_table[snd->duty][snd->duty_count];
      snd->frequency_counter = snd->frequency + (short)(uVar2 % (uint)uVar1);
    }
  }
  return;
}

Assistant:

static void gb_update_square_channel(struct SOUND *snd, UINT32 cycles)
{
	if (snd->on)
	{
		UINT16 distance;
		// compensate for leftover cycles
		snd->cycles_left += cycles;
		if (snd->cycles_left <= 0)
			return;

		cycles = snd->cycles_left >> 2;
		snd->cycles_left &= 3;
		distance = 0x800 - snd->frequency_counter;
		if (cycles >= distance)
		{
			UINT32 counter;
			cycles -= distance;
			distance = 0x800 - snd->frequency;
			counter = 1 + cycles / distance;

			snd->duty_count = (snd->duty_count + counter) & 0x07;
			snd->signal = wave_duty_table[snd->duty][snd->duty_count];

			snd->frequency_counter = snd->frequency + cycles % distance;
		}
		else
		{
			snd->frequency_counter += cycles;
		}
	}
}